

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

TokenType __thiscall enact::Lexer::getIdentifierType(Lexer *this,string *candidate)

{
  size_type sVar1;
  mapped_type *pmVar2;
  string *candidate_local;
  Lexer *this_local;
  
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>_>
          ::count(&this->m_keywords,candidate);
  if (sVar1 == 0) {
    this_local._4_4_ = IDENTIFIER;
  }
  else {
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>_>_>
             ::at(&this->m_keywords,candidate);
    this_local._4_4_ = *pmVar2;
  }
  return this_local._4_4_;
}

Assistant:

TokenType Lexer::getIdentifierType(const std::string& candidate) {
        if (m_keywords.count(candidate) > 0) {
            return m_keywords.at(candidate);
        }

        return TokenType::IDENTIFIER;
    }